

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

bool __thiscall testing::internal::linked_ptr_internal::depart(linked_ptr_internal *this)

{
  linked_ptr_internal *local_30;
  linked_ptr_internal *p;
  GTestMutexLock local_20;
  MutexLock lock;
  linked_ptr_internal *this_local;
  
  lock.mutex_ = (MutexBase *)this;
  GTestMutexLock::GTestMutexLock(&local_20,(MutexBase *)g_linked_ptr_mutex);
  if (this->next_ == this) {
    this_local._7_1_ = true;
  }
  else {
    for (local_30 = this->next_; local_30->next_ != this; local_30 = local_30->next_) {
      if (local_30->next_ == this->next_) {
        __assert_fail("p->next_ != next_ && \"Trying to depart() a linked ring we are not in. \" \"Is GMock thread safety enabled?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/google/googletest/include/gtest/internal/gtest-linked_ptr.h"
                      ,0x86,"bool testing::internal::linked_ptr_internal::depart()");
      }
    }
    local_30->next_ = this->next_;
    this_local._7_1_ = false;
  }
  GTestMutexLock::~GTestMutexLock(&local_20);
  return this_local._7_1_;
}

Assistant:

bool depart()
      GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    if (next_ == this) return true;
    linked_ptr_internal const* p = next_;
    while (p->next_ != this) {
      assert(p->next_ != next_ &&
             "Trying to depart() a linked ring we are not in. "
             "Is GMock thread safety enabled?");
      p = p->next_;
    }
    p->next_ = next_;
    return false;
  }